

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O2

Expression * wasm::fromABI(Expression *value,Type type,Module *module)

{
  BasicType BVar1;
  Drop *pDVar2;
  UnaryOp op;
  Type local_28;
  Type type_local;
  Builder builder;
  
  local_28.id = type.id;
  type_local.id = (uintptr_t)module;
  BVar1 = Type::getBasic(&local_28);
  switch(BVar1) {
  case none:
    pDVar2 = Builder::makeDrop((Builder *)&type_local,value);
    return (Expression *)pDVar2;
  default:
    goto switchD_0083f96d_caseD_1;
  case i32:
    op = WrapInt64;
    break;
  case f32:
    value = (Expression *)Builder::makeUnary((Builder *)&type_local,WrapInt64,value);
    op = ReinterpretInt32;
    break;
  case f64:
    op = ReinterpretInt64;
    break;
  case v128:
    handle_unreachable("v128 not implemented yet",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/FuncCastEmulation.cpp"
                       ,0x65);
  }
  value = (Expression *)Builder::makeUnary((Builder *)&type_local,op,value);
switchD_0083f96d_caseD_1:
  return (Expression *)(Unary *)value;
}

Assistant:

static Expression* fromABI(Expression* value, Type type, Module* module) {
  Builder builder(*module);
  switch (type.getBasic()) {
    case Type::i32: {
      value = builder.makeUnary(WrapInt64, value);
      break;
    }
    case Type::i64: {
      // already good
      break;
    }
    case Type::f32: {
      value = builder.makeUnary(ReinterpretInt32,
                                builder.makeUnary(WrapInt64, value));
      break;
    }
    case Type::f64: {
      value = builder.makeUnary(ReinterpretInt64, value);
      break;
    }
    case Type::v128: {
      WASM_UNREACHABLE("v128 not implemented yet");
    }
    case Type::none: {
      value = builder.makeDrop(value);
      break;
    }
    case Type::unreachable: {
      // can leave it, the call isn't taken anyhow
      break;
    }
  }
  return value;
}